

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vdrawhelper_sse2.cpp
# Opt level: O0

void src_Source(uint32_t *dest,int length,uint32_t *src,uint32_t const_alpha)

{
  __m128i c1;
  __m128i c0;
  __m128i a;
  uint32_t uVar1;
  uint32_t in_ECX;
  uint32_t *in_RDX;
  int in_ESI;
  uint32_t *in_RDI;
  longlong extraout_XMM0_Qa;
  longlong extraout_XMM0_Qb;
  __m128i v_dest;
  __m128i v_src;
  __m128i v_alpha;
  int ialpha;
  uint32_t *local_70;
  int local_64;
  uint32_t *puVar2;
  longlong in_stack_ffffffffffffffa8;
  longlong in_stack_ffffffffffffffb0;
  uint32_t *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint32_t uVar3;
  longlong lVar4;
  
  if (in_ECX == 0xff) {
    memcpy(in_RDI,in_RDX,(long)in_ESI << 2);
  }
  else {
    lVar4 = CONCAT44(in_ECX,in_ECX);
    local_70 = in_RDX;
    local_64 = in_ESI;
    uVar3 = in_ECX;
    for (; ((ulong)in_RDI & 0xf) != 0 && local_64 != 0; in_RDI = in_RDI + 1) {
      uVar1 = interpolate_pixel(*local_70,in_ECX,*in_RDI,0xff - in_ECX);
      *in_RDI = uVar1;
      local_70 = local_70 + 1;
      local_64 = local_64 + -1;
    }
    while (puVar2 = in_RDI, local_64 != 0) {
      if (local_64 - 1U < 3) {
        uVar1 = interpolate_pixel(*local_70,in_ECX,*puVar2,0xff - in_ECX);
        *puVar2 = uVar1;
        local_70 = local_70 + 1;
        local_64 = local_64 + -1;
        in_RDI = puVar2 + 1;
      }
      else {
        a[0]._4_4_ = uVar3;
        a[0]._0_4_ = in_stack_ffffffffffffffc0;
        a[1] = lVar4;
        c0[1] = (longlong)in_stack_ffffffffffffffb8;
        c0[0] = in_stack_ffffffffffffffb0;
        c1[1] = in_stack_ffffffffffffffa8;
        c1[0] = (longlong)puVar2;
        v4_interpolate_color_sse2(a,c0,c1);
        *(longlong *)puVar2 = extraout_XMM0_Qa;
        *(longlong *)(puVar2 + 2) = extraout_XMM0_Qb;
        local_70 = local_70 + 4;
        local_64 = local_64 + -4;
        in_RDI = puVar2 + 4;
        in_stack_ffffffffffffffa8 = extraout_XMM0_Qa;
        in_stack_ffffffffffffffb0 = extraout_XMM0_Qb;
        in_stack_ffffffffffffffb8 = puVar2;
      }
    }
  }
  return;
}

Assistant:

static void src_Source(uint32_t* dest, int length, const uint32_t* src,
                           uint32_t const_alpha)
{
    int ialpha;
    if (const_alpha == 255) {
        memcpy(dest, src, length * sizeof(uint32_t));
    } else {
        ialpha = 255 - const_alpha;
        __m128i v_alpha = _mm_set1_epi32(const_alpha);

        LOOP_ALIGNED_U1_A4(dest, length,
                           { /* UOP */
                             *dest = interpolate_pixel(*src, const_alpha,
                                                       *dest, ialpha);
                             dest++;
                             src++;
                             length--;
                           },
                           {/* A4OP */
                            V4_FETCH_SRC_DEST V4_COMP_OP_SRC V4_STORE_DEST
                                                             V4_SRC_DEST_LEN_INC})
    }
}